

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O3

int x25519_encap_with_seed
              (EVP_HPKE_KEM *kem,uint8_t *out_shared_secret,size_t *out_shared_secret_len,
              uint8_t *out_enc,size_t *out_enc_len,size_t max_enc,uint8_t *peer_public_key,
              size_t peer_public_key_len,uint8_t *seed,size_t seed_len)

{
  uint16_t kem_id;
  int iVar1;
  EVP_MD *hkdf_md;
  int line;
  uint8_t kem_context [64];
  size_t in_stack_ffffffffffffff60;
  uint8_t local_98 [32];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (max_enc < 0x20) {
    iVar1 = 0x89;
    line = 0xae;
  }
  else if (seed_len == 0x20) {
    X25519_public_from_private(out_enc,seed);
    if ((peer_public_key_len == 0x20) && (iVar1 = X25519(local_98,seed,peer_public_key), iVar1 != 0)
       ) {
      local_78 = *(undefined8 *)out_enc;
      uStack_70 = *(undefined8 *)(out_enc + 8);
      local_68 = *(undefined8 *)(out_enc + 0x10);
      uStack_60 = *(undefined8 *)(out_enc + 0x18);
      local_58 = *(undefined8 *)peer_public_key;
      uStack_50 = *(undefined8 *)(peer_public_key + 8);
      local_48 = *(undefined8 *)(peer_public_key + 0x10);
      uStack_40 = *(undefined8 *)(peer_public_key + 0x18);
      kem_id = kem->id;
      hkdf_md = EVP_sha256();
      iVar1 = dhkem_extract_and_expand
                        (kem_id,(EVP_MD *)hkdf_md,out_shared_secret,(size_t)local_98,(uint8_t *)0x20
                         ,(size_t)&local_78,(uint8_t *)0x40,in_stack_ffffffffffffff60);
      if (iVar1 != 0) {
        *out_enc_len = 0x20;
        *out_shared_secret_len = 0x20;
        return 1;
      }
      return 0;
    }
    iVar1 = 0x86;
    line = 0xba;
  }
  else {
    iVar1 = 0x66;
    line = 0xb2;
  }
  ERR_put_error(6,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke.cc"
                ,line);
  return 0;
}

Assistant:

static int x25519_encap_with_seed(
    const EVP_HPKE_KEM *kem, uint8_t *out_shared_secret,
    size_t *out_shared_secret_len, uint8_t *out_enc, size_t *out_enc_len,
    size_t max_enc, const uint8_t *peer_public_key, size_t peer_public_key_len,
    const uint8_t *seed, size_t seed_len) {
  if (max_enc < X25519_PUBLIC_VALUE_LEN) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_BUFFER_SIZE);
    return 0;
  }
  if (seed_len != X25519_PRIVATE_KEY_LEN) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }
  X25519_public_from_private(out_enc, seed);

  uint8_t dh[X25519_SHARED_KEY_LEN];
  if (peer_public_key_len != X25519_PUBLIC_VALUE_LEN ||
      !X25519(dh, seed, peer_public_key)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_PEER_KEY);
    return 0;
  }

  uint8_t kem_context[2 * X25519_PUBLIC_VALUE_LEN];
  OPENSSL_memcpy(kem_context, out_enc, X25519_PUBLIC_VALUE_LEN);
  OPENSSL_memcpy(kem_context + X25519_PUBLIC_VALUE_LEN, peer_public_key,
                 X25519_PUBLIC_VALUE_LEN);
  if (!dhkem_extract_and_expand(kem->id, EVP_sha256(), out_shared_secret,
                                SHA256_DIGEST_LENGTH, dh, sizeof(dh),
                                kem_context, sizeof(kem_context))) {
    return 0;
  }

  *out_enc_len = X25519_PUBLIC_VALUE_LEN;
  *out_shared_secret_len = SHA256_DIGEST_LENGTH;
  return 1;
}